

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

void __thiscall
TTD::ThreadContextTTD::ClearContextsForSnapRestore
          (ThreadContextTTD *this,
          List<FinalizableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *deadCtxs)

{
  int iVar1;
  int iVar2;
  Type *ppSVar3;
  FinalizableObject *local_30;
  FinalizableObject *externalCtx;
  ScriptContext *ctx;
  List<FinalizableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLStack_18;
  int32 i;
  List<FinalizableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *deadCtxs_local;
  ThreadContextTTD *this_local;
  
  ctx._4_4_ = 0;
  pLStack_18 = deadCtxs;
  deadCtxs_local =
       (List<FinalizableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)this;
  while( true ) {
    iVar1 = ctx._4_4_;
    iVar2 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::Count
                      (&(this->m_contextList).
                        super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                      );
    if (iVar2 <= iVar1) break;
    ppSVar3 = JsUtil::
              List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(&this->m_contextList,ctx._4_4_);
    externalCtx = (FinalizableObject *)*ppSVar3;
    local_30 = JsUtil::
               BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::Item(&this->m_ttdContextToExternalRefMap,(ScriptContext **)&externalCtx);
    JsUtil::
    List<FinalizableObject_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    Add(pLStack_18,&local_30);
    ctx._4_4_ = ctx._4_4_ + 1;
  }
  JsUtil::
  BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Clear(&this->m_ttdContextToExternalRefMap);
  JsUtil::
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  Clear(&this->m_contextList);
  this->m_activeContext = (ScriptContext *)0x0;
  return;
}

Assistant:

void ThreadContextTTD::ClearContextsForSnapRestore(JsUtil::List<FinalizableObject*, HeapAllocator>& deadCtxs)
    {
        for(int32 i = 0; i < this->m_contextList.Count(); ++i)
        {
            Js::ScriptContext* ctx = this->m_contextList.Item(i);
            FinalizableObject* externalCtx = this->m_ttdContextToExternalRefMap.Item(ctx);

            deadCtxs.Add(externalCtx);
        }
        this->m_ttdContextToExternalRefMap.Clear();
        this->m_contextList.Clear();

        this->m_activeContext = nullptr;
    }